

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

void __thiscall mocker::Lexer::punct(Lexer *this,string *curTok)

{
  byte bVar1;
  LexError *this_00;
  TokenID local_14;
  
  bVar1 = *(curTok->_M_dataplus)._M_p;
  if (bVar1 < 0x5d) {
    switch(bVar1) {
    case 0x21:
      break;
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x27:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x3a:
switchD_00178478_caseD_22:
      this_00 = (LexError *)__cxa_allocate_exception(0x48);
      LexError::LexError(this_00,this->curPos,this->nxtPos);
      __cxa_throw(this_00,&LexError::typeinfo,CompileError::~CompileError);
    case 0x25:
      break;
    case 0x26:
      break;
    case 0x28:
      break;
    case 0x29:
      break;
    case 0x2a:
      break;
    case 0x2b:
      break;
    case 0x2c:
      break;
    case 0x2d:
      break;
    case 0x2e:
      break;
    case 0x2f:
      break;
    case 0x3b:
      break;
    case 0x3c:
      break;
    case 0x3d:
      break;
    case 0x3e:
      break;
    default:
      if (bVar1 != 0x5b) goto switchD_00178478_caseD_22;
    }
  }
  else {
    switch(bVar1) {
    case 0x7b:
      break;
    case 0x7c:
      break;
    case 0x7d:
      break;
    case 0x7e:
      break;
    default:
      if ((bVar1 != 0x5d) && (bVar1 != 0x5e)) goto switchD_00178478_caseD_22;
    }
  }
  std::vector<mocker::Token,std::allocator<mocker::Token>>::
  emplace_back<mocker::TokenID&,mocker::Position&,mocker::Position&>
            ((vector<mocker::Token,std::allocator<mocker::Token>> *)&this->tokens,&local_14,
             &this->curPos,&this->nxtPos);
  return;
}

Assistant:

void Lexer::punct(const std::string &curTok) {
  auto add = [this](TokenID id) { tokens.emplace_back(id, curPos, nxtPos); };
  switch (curTok[0]) {
  case '(':
    MOCKER_ADD(TokenID::LeftParen);
  case ')':
    MOCKER_ADD(TokenID::RightParen);
  case '[':
    MOCKER_ADD(TokenID::LeftBracket);
  case ']':
    MOCKER_ADD(TokenID::RightBracket);
  case '{':
    MOCKER_ADD(TokenID::LeftBrace);
  case '}':
    MOCKER_ADD(TokenID::RightBrace);
  case ';':
    MOCKER_ADD(TokenID::Semicolon);
  case ',':
    MOCKER_ADD(TokenID::Comma);
  case '+':
    add(curTok.size() == 2 ? TokenID::PlusPlus : TokenID::Plus);
    break;
  case '-':
    add(curTok.size() == 2 ? TokenID::MinusMinus : TokenID::Minus);
    break;
  case '*':
    MOCKER_ADD(TokenID::Mult);
  case '/':
    MOCKER_ADD(TokenID::Divide);
  case '%':
    MOCKER_ADD(TokenID::Mod);
  case '>':
    if (curTok.size() == 1) {
      add(TokenID::GreaterThan);
      break;
    }
    add(curTok[1] == '=' ? TokenID::GreaterEqual : TokenID::RightShift);
    break;
  case '<':
    if (curTok.size() == 1) {
      add(TokenID::LessThan);
      break;
    }
    add(curTok[1] == '=' ? TokenID::LessEqual : TokenID::LeftShift);
    break;
  case '=':
    add(curTok.size() == 1 ? TokenID::Assign : TokenID::Equal);
    break;
  case '!':
    add(curTok.size() == 1 ? TokenID::LogicalNot : TokenID::NotEqual);
    break;
  case '&':
    add(curTok.size() == 1 ? TokenID::BitAnd : TokenID::LogicalAnd);
    break;
  case '|':
    add(curTok.size() == 1 ? TokenID::BitOr : TokenID::LogicalOr);
    break;
  case '~':
    MOCKER_ADD(TokenID::BitNot);
  case '^':
    MOCKER_ADD(TokenID::BitXor);
  case '.':
    MOCKER_ADD(TokenID::Dot);
  default:
    throw LexError(curPos, nxtPos);
  }
}